

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.h
# Opt level: O3

void __thiscall
uuids::uuid_name_generator::process_characters<wchar_t,std::char_traits<wchar_t>>
          (uuid_name_generator *this,basic_string_view<wchar_t,_std::char_traits<wchar_t>_> str)

{
  undefined4 uVar1;
  const_iterator __begin0;
  long lVar2;
  sha1 *this_00;
  
  if (str._M_len != 0) {
    this_00 = &this->hasher;
    lVar2 = 0;
    do {
      uVar1 = *(undefined4 *)((long)str._M_str + lVar2);
      detail::sha1::process_byte(this_00,(uint8_t)uVar1);
      detail::sha1::process_byte(this_00,(uint8_t)((uint)uVar1 >> 8));
      detail::sha1::process_byte(this_00,(uint8_t)((uint)uVar1 >> 0x10));
      detail::sha1::process_byte(this_00,(uint8_t)((uint)uVar1 >> 0x18));
      lVar2 = lVar2 + 4;
    } while (str._M_len << 2 != lVar2);
  }
  return;
}

Assistant:

void process_characters(std::basic_string_view<CharT, Traits> const str)
      {
         for (uint32_t c : str)
         {
            hasher.process_byte(static_cast<uint8_t>(c & 0xFF));
            if constexpr (!std::is_same_v<CharT, char>)
            {
               hasher.process_byte(static_cast<uint8_t>((c >> 8) & 0xFF));
               hasher.process_byte(static_cast<uint8_t>((c >> 16) & 0xFF));
               hasher.process_byte(static_cast<uint8_t>((c >> 24) & 0xFF));
            }
         }
      }